

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw.cc
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  char *__s;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char **ppcVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  pointer ppVar12;
  string *input_stream;
  int num_order;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> viterbi_path;
  vector<double,_std::allocator<double>_> tmp_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  query_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  reference_vectors;
  double total_score;
  DynamicTimeWarping dynamic_time_warping;
  ostringstream error_message;
  int local_4bc;
  DistanceMetrics local_4b8;
  LocalPathConstraints local_4b4;
  char *local_4b0;
  string local_4a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_488;
  char *local_468;
  string local_460 [3];
  ios_base local_3f0 [264];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2c8;
  char *local_2a8;
  double local_2a0;
  DynamicTimeWarping local_298;
  string local_238;
  uint auStack_218 [20];
  ios_base local_1c8 [408];
  
  local_4bc = 0x19;
  local_468 = (char *)0x0;
  local_4b4 = kType4;
  local_4b8 = kEuclidean;
  local_4b0 = (char *)0x0;
  iVar10 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"l:m:p:d:P:S:h",(option *)0x0,(int *)0x0);
    if (iVar5 < 100) {
      if (iVar5 != -1) {
        if (iVar5 == 0x50) {
          local_468 = ya_optarg;
        }
        else {
          if (iVar5 != 0x53) goto switchD_00103855_caseD_69;
          local_4b0 = ya_optarg;
        }
        goto LAB_00103cea;
      }
      iVar5 = 2;
      goto LAB_00103cec;
    }
    switch(iVar5) {
    case 0x68:
      anon_unknown.dwarf_461b::PrintUsage((ostream *)&std::cout);
      iVar10 = 0;
      iVar5 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_460);
      bVar4 = sptk::ConvertStringToInteger(&local_238,&local_4bc);
      bVar2 = 0 < local_4bc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar4 && bVar2) {
        local_4bc = local_4bc + -1;
        goto LAB_00103cea;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be a positive integer",
                 0x39);
      local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
      sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
LAB_00103bc1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
        operator_delete(local_460[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      goto LAB_00103bf1;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_460);
      bVar2 = sptk::ConvertStringToInteger(&local_238,&local_4bc);
      bVar4 = local_4bc < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
        goto LAB_00103bc1;
      }
LAB_00103cea:
      iVar5 = 0;
      break;
    case 0x70:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_460);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_298);
      if (bVar2) {
        bVar2 = sptk::IsInRange((DistanceMetrics)local_298._vptr_DynamicTimeWarping,0,6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00103a72;
        iVar5 = 4;
        bVar2 = true;
        local_4b4 = (DistanceMetrics)local_298._vptr_DynamicTimeWarping;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
LAB_00103a72:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -p option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
        std::ostream::operator<<((ostream *)poVar6,6);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
LAB_00103ca9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
          operator_delete(local_460[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar5 = 1;
        bVar2 = false;
        iVar10 = 1;
      }
LAB_00103ce6:
      if (bVar2) goto LAB_00103cea;
      break;
    default:
      if (iVar5 == 100) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_460);
        bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_298);
        if (bVar2) {
          bVar2 = sptk::IsInRange((DistanceMetrics)local_298._vptr_DynamicTimeWarping,0,3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (bVar2) {
            iVar5 = 4;
            bVar2 = true;
            local_4b8 = (DistanceMetrics)local_298._vptr_DynamicTimeWarping;
            goto LAB_00103ce6;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -d option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
        std::ostream::operator<<((ostream *)poVar6,3);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
        goto LAB_00103ca9;
      }
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
switchD_00103855_caseD_69:
      anon_unknown.dwarf_461b::PrintUsage((ostream *)&std::cerr);
LAB_00103bf1:
      iVar5 = 1;
      iVar10 = 1;
    }
LAB_00103cec:
  } while (iVar5 == 0);
  if (iVar5 != 2) {
    return iVar10;
  }
  if (argc - ya_optind == 1) {
    ppcVar7 = argv + (long)argc + -1;
    pcVar11 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Just two input files, file1 and infile, are required",0x34);
      local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
      sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
      goto LAB_00103ea6;
    }
    ppcVar7 = argv + (long)argc + -2;
    pcVar11 = ppcVar7[1];
  }
  __s = *ppcVar7;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
    sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
LAB_00103ea6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
      operator_delete(local_460[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  lVar9 = (long)local_4bc;
  local_2c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&local_238);
  local_2a8 = pcVar11;
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s);
  uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
  iVar5 = (int)(lVar9 + 1U);
  if ((uVar1 & 5) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_460,lVar9 + 1U,
               (allocator_type *)&local_298);
    while (bVar2 = sptk::ReadStream<double>
                             (false,0,0,iVar5,(vector<double,_std::allocator<double>_> *)local_460,
                              (istream *)&local_238,(int *)0x0), bVar2) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_2c8,(value_type *)local_460);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_460[0]._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_460,"Cannot open file ",0x11);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffb38 +
                      (int)*(undefined8 *)(local_460[0]._M_dataplus._M_p + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,__s,sVar8);
    }
    local_298._vptr_DynamicTimeWarping = (_func_int **)&local_298.distance_calculation_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"dtw","");
    sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_460);
    if ((DistanceCalculation *)local_298._vptr_DynamicTimeWarping !=
        &local_298.distance_calculation_) {
      operator_delete(local_298._vptr_DynamicTimeWarping);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
    std::ios_base::~ios_base(local_3f0);
    iVar10 = 1;
  }
  std::ifstream::~ifstream(&local_238);
  if ((uVar1 & 5) != 0) goto LAB_001047f4;
  local_2e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input_stream = &local_238;
  std::ifstream::ifstream(input_stream);
  pcVar11 = local_2a8;
  if ((local_2a8 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_2a8),
     (*(byte *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) & 5) == 0)) {
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      input_stream = (string *)&std::cin;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_460,(long)iVar5,
               (allocator_type *)&local_298);
    while (bVar2 = sptk::ReadStream<double>
                             (false,0,0,iVar5,(vector<double,_std::allocator<double>_> *)local_460,
                              (istream *)input_stream,(int *)0x0), bVar2) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_2e8,(value_type *)local_460);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_460[0]._M_dataplus._M_p);
    }
    bVar2 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_460,"Cannot open file ",0x11);
    sVar8 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,pcVar11,sVar8);
    local_298._vptr_DynamicTimeWarping = (_func_int **)&local_298.distance_calculation_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"dtw","");
    sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_460);
    if ((DistanceCalculation *)local_298._vptr_DynamicTimeWarping !=
        &local_298.distance_calculation_) {
      operator_delete(local_298._vptr_DynamicTimeWarping);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
    std::ios_base::~ios_base(local_3f0);
    iVar10 = 1;
    bVar2 = false;
  }
  std::ifstream::~ifstream(&local_238);
  if (bVar2) {
    sptk::DynamicTimeWarping::DynamicTimeWarping(&local_298,local_4bc,local_4b4,local_4b8);
    if (local_298.is_valid_ == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Failed to initialize DynamicTimeWarping",0x27);
      local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
      sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
        operator_delete(local_460[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar10 = 1;
    }
    else {
      local_488.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_488.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_488.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = sptk::DynamicTimeWarping::Run(&local_298,&local_2e8,&local_2c8,&local_488,&local_2a0);
      if (bVar2) {
        bVar2 = local_488.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_488.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        ppVar12 = local_488.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        while (!bVar2) {
          bVar4 = sptk::WriteStream<double>
                            (0,iVar5,local_2e8.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + ppVar12->first,
                             (ostream *)&std::cout,(int *)0x0);
          if ((!bVar4) ||
             (bVar4 = sptk::WriteStream<double>
                                (0,iVar5,local_2c8.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + ppVar12->second
                                 ,(ostream *)&std::cout,(int *)0x0), !bVar4)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"Failed to write warped vector",0x1d);
            local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
            sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
              operator_delete(local_460[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
            std::ios_base::~ios_base(local_1c8);
            iVar10 = 1;
            break;
          }
          ppVar12 = ppVar12 + 1;
          bVar2 = ppVar12 ==
                  local_488.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        }
        pcVar11 = local_468;
        if (bVar2) {
          if (local_468 != (char *)0x0) {
            std::ofstream::ofstream(&local_238);
            std::ofstream::open((char *)&local_238,(_Ios_Openmode)pcVar11);
            if ((*(byte *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) & 5)
                == 0) {
              bVar2 = local_488.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      local_488.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
              if (!bVar2) {
                ppVar12 = local_488.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar4 = sptk::WriteStream<int>(ppVar12->first,(ostream *)&local_238);
                  if ((!bVar4) ||
                     (bVar4 = sptk::WriteStream<int>(ppVar12->second,(ostream *)&local_238), !bVar4)
                     ) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_460,"Failed to write Viterbi path",0x1c);
                    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
                    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                      operator_delete(local_4a8._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
                    std::ios_base::~ios_base(local_3f0);
                    iVar10 = 1;
                    break;
                  }
                  ppVar12 = ppVar12 + 1;
                  bVar2 = ppVar12 ==
                          local_488.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                } while (!bVar2);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_460,"Cannot open file ",0x11);
              sVar8 = strlen(pcVar11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,pcVar11,sVar8)
              ;
              local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
              sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                operator_delete(local_4a8._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
              std::ios_base::~ios_base(local_3f0);
              iVar10 = 1;
              bVar2 = false;
            }
            std::ofstream::~ofstream(&local_238);
            if (!bVar2) goto LAB_001047cb;
          }
          if (local_4b0 != (char *)0x0) {
            std::ofstream::ofstream(&local_238);
            std::ofstream::open((char *)&local_238,(_Ios_Openmode)local_4b0);
            if ((*(byte *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) & 5)
                == 0) {
              bVar2 = sptk::WriteStream<double>(local_2a0,(ostream *)&local_238);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_460,"Failed to write total score",0x1b);
                local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
                sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                  operator_delete(local_4a8._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
                std::ios_base::~ios_base(local_3f0);
                iVar10 = 1;
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_460,"Cannot open file ",0x11);
              pcVar11 = local_4b0;
              sVar8 = strlen(local_4b0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,pcVar11,sVar8)
              ;
              local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"dtw","");
              sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                operator_delete(local_4a8._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
              std::ios_base::~ios_base(local_3f0);
              iVar10 = 1;
              bVar2 = false;
            }
            std::ofstream::~ofstream(&local_238);
            if (bVar2 == false) goto LAB_001047cb;
          }
          iVar10 = 0;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Failed to perform dynamic time warping",0x26);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"dtw","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
          operator_delete(local_460[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar10 = 1;
      }
LAB_001047cb:
      if (local_488.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_488.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    sptk::DynamicTimeWarping::~DynamicTimeWarping(&local_298);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2e8);
LAB_001047f4:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2c8);
  return iVar10;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  sptk::DynamicTimeWarping::LocalPathConstraints local_path_constraint(
      kDefaultLocalPathConstraint);
  sptk::DistanceCalculation::DistanceMetrics distance_metric(
      kDefaultDistanceMetric);
  const char* total_score_file(NULL);
  const char* viterbi_path_file(NULL);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:d:P:S:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DynamicTimeWarping::LocalPathConstraints::kNumTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -p option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        local_path_constraint =
            static_cast<sptk::DynamicTimeWarping::LocalPathConstraints>(tmp);
        break;
      }
      case 'd': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DistanceCalculation::DistanceMetrics::kNumMetrics) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        distance_metric =
            static_cast<sptk::DistanceCalculation::DistanceMetrics>(tmp);
        break;
      }
      case 'P': {
        viterbi_path_file = optarg;
        break;
      }
      case 'S': {
        total_score_file = optarg;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }
  const int length(num_order + 1);

  std::vector<std::vector<double> > reference_vectors;
  {
    std::ifstream ifs;
    ifs.open(reference_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << reference_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      reference_vectors.push_back(tmp);
    }
  }

  std::vector<std::vector<double> > query_vectors;
  {
    std::ifstream ifs;
    if (NULL != query_file) {
      ifs.open(query_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << query_file;
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      query_vectors.push_back(tmp);
    }
  }

  sptk::DynamicTimeWarping dynamic_time_warping(
      num_order, local_path_constraint, distance_metric);
  if (!dynamic_time_warping.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DynamicTimeWarping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  std::vector<std::pair<int, int> > viterbi_path;
  double total_score;
  if (!dynamic_time_warping.Run(query_vectors, reference_vectors, &viterbi_path,
                                &total_score)) {
    std::ostringstream error_message;
    error_message << "Failed to perform dynamic time warping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
       itr != viterbi_path.end(); ++itr) {
    if (!sptk::WriteStream(0, length, query_vectors[itr->first], &std::cout,
                           NULL) ||
        !sptk::WriteStream(0, length, reference_vectors[itr->second],
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write warped vector";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  if (NULL != viterbi_path_file) {
    std::ofstream ofs;
    ofs.open(viterbi_path_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << viterbi_path_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
         itr != viterbi_path.end(); ++itr) {
      if (!sptk::WriteStream(itr->first, &output_stream) ||
          !sptk::WriteStream(itr->second, &output_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to write Viterbi path";
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
  }

  if (NULL != total_score_file) {
    std::ofstream ofs;
    ofs.open(total_score_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_score_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_score, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total score";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  return 0;
}